

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::cmOSXBundleGenerator
          (cmOSXBundleGenerator *this,cmGeneratorTarget *target,string *configName)

{
  cmLocalGenerator *pcVar1;
  
  this->GT = target;
  this->Makefile = target->Target->Makefile;
  pcVar1 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar1;
  std::__cxx11::string::string((string *)&this->ConfigName,(string *)configName);
  this->MacContentFolders =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  MustSkip(this);
  return;
}

Assistant:

cmOSXBundleGenerator::cmOSXBundleGenerator(cmGeneratorTarget* target,
                                           const std::string& configName)
  : GT(target)
  , Makefile(target->Target->GetMakefile())
  , LocalGenerator(target->GetLocalGenerator())
  , ConfigName(configName)
  , MacContentFolders(CM_NULLPTR)
{
  if (this->MustSkip()) {
    return;
  }
}